

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_slider_float(nk_context *ctx,float min_value,float *value,float max_value,
                       float value_step)

{
  nk_image *img;
  float fVar1;
  nk_vec2 nVar2;
  nk_color c;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var5;
  undefined1 auVar6 [12];
  nk_widget_layout_states nVar7;
  nk_bool nVar8;
  long lVar9;
  uint uVar10;
  nk_style_slider *pnVar11;
  nk_context *in;
  long lVar12;
  int *piVar13;
  nk_command_buffer *out;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar26;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect r_00;
  nk_rect r_01;
  nk_rect bounds;
  float local_110;
  undefined8 local_108;
  float local_e8;
  undefined8 local_b8;
  undefined8 local_a8;
  nk_flags local_7c;
  nk_rect local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar24 [16];
  
  uVar10 = 0;
  if ((((ctx != (nk_context *)0x0) && (pnVar3 = ctx->current, pnVar3 != (nk_window *)0x0)) &&
      (pnVar4 = pnVar3->layout, value != (float *)0x0 && pnVar4 != (nk_panel *)0x0)) &&
     (nVar7 = nk_widget(&local_78,ctx), uVar10 = 0, nVar7 != NK_WIDGET_INVALID)) {
    in = (nk_context *)0x0;
    if ((pnVar4->flags & 0x1000) == 0) {
      in = ctx;
    }
    fVar1 = *value;
    out = &pnVar3->buffer;
    nVar2 = (ctx->style).slider.padding;
    fVar16 = nVar2.x;
    bounds_00.x = local_78.x + fVar16;
    fVar26 = nVar2.y;
    bounds_00.y = local_78.y + fVar26;
    auVar23._0_4_ = fVar16 + fVar16 + (ctx->style).slider.cursor_size.x;
    auVar6._4_8_ = (ulong)nVar2 >> 0x20;
    auVar6._0_4_ = auVar23._0_4_;
    auVar24._0_8_ = auVar6._0_8_;
    auVar24._8_4_ = fVar26;
    auVar24._12_4_ = fVar26;
    auVar23._8_8_ = auVar24._8_8_;
    auVar23._4_4_ = fVar26 + fVar26;
    auVar25._8_8_ = 0;
    auVar25._0_4_ = local_78.w;
    auVar25._4_4_ = local_78.h;
    auVar25 = maxps(auVar23,auVar25);
    fVar22 = auVar25._0_4_ - (fVar16 + fVar16);
    fVar26 = auVar25._4_4_ - (fVar26 + fVar26);
    fVar16 = fVar1;
    if ((ctx->style).slider.show_buttons != 0) {
      font = (ctx->style).font;
      bounds_01.h = fVar26;
      bounds_01.w = fVar26;
      bounds_00.w = fVar26;
      bounds_00.h = fVar26;
      nVar8 = nk_do_button_symbol(&local_7c,out,bounds_00,(ctx->style).slider.dec_symbol,
                                  NK_BUTTON_DEFAULT,&(ctx->style).slider.dec_button,&in->input,font)
      ;
      if (nVar8 != 0) {
        fVar16 = fVar1 - value_step;
      }
      bounds_01.y = bounds_00.y;
      bounds_01.x = (bounds_00.x + fVar22) - fVar26;
      nVar8 = nk_do_button_symbol(&local_7c,out,bounds_01,(ctx->style).slider.inc_symbol,
                                  NK_BUTTON_DEFAULT,&(ctx->style).slider.inc_button,&in->input,font)
      ;
      if (nVar8 != 0) {
        fVar16 = fVar16 + value_step;
      }
      fVar20 = (ctx->style).slider.spacing.x;
      bounds_00.x = bounds_00.x + fVar26 + fVar20;
      fVar22 = fVar22 - (fVar26 + fVar26 + fVar20 + fVar20);
    }
    fVar20 = min_value;
    if (max_value <= min_value) {
      fVar20 = max_value;
      max_value = min_value;
    }
    if (max_value <= fVar16) {
      fVar16 = max_value;
    }
    local_110 = fVar20;
    if (fVar20 <= fVar16) {
      local_110 = fVar16;
    }
    nVar2 = (ctx->style).slider.cursor_size;
    fVar27 = nVar2.x;
    fVar16 = nVar2.y;
    fVar21 = fVar27 * 0.5;
    fVar28 = fVar21 + bounds_00.x;
    fVar22 = fVar22 - fVar27;
    fVar17 = fVar22 / ((max_value - fVar20) / value_step);
    local_e8 = ((local_110 - fVar20) / value_step) * fVar17 + fVar28;
    ctx->last_widget_state = ctx->last_widget_state & 2 | 4;
    if (in == (nk_context *)0x0) {
      bVar14 = false;
    }
    else {
      bVar14 = (in->input).mouse.buttons[0].down != 0;
    }
    fVar29 = (fVar26 * 0.5 + bounds_00.y) - fVar16 * 0.5;
    fVar18 = local_e8 - fVar21;
    if (in == (nk_context *)0x0) {
      bVar15 = false;
    }
    else {
      fVar19 = (in->input).mouse.buttons[0].clicked_pos.x;
      bVar15 = false;
      if ((fVar18 <= fVar19) && (fVar19 < fVar27 + fVar18)) {
        fVar19 = (in->input).mouse.buttons[0].clicked_pos.y;
        bVar15 = false;
        if ((fVar29 <= fVar19) && (bVar15 = false, fVar19 < fVar16 + fVar29)) {
          bVar15 = (in->input).mouse.buttons[0].down == 1;
        }
      }
    }
    if ((bool)(bVar14 & bVar15)) {
      fVar19 = (in->input).mouse.pos.x - (fVar27 * 0.5 + fVar18);
      ctx->last_widget_state = 0x22;
      fVar18 = -fVar19;
      if (-fVar19 <= fVar19) {
        fVar18 = fVar19;
      }
      if (fVar17 <= fVar18) {
        fVar18 = local_110 +
                 (float)(~-(uint)(0.0 < fVar19) & (uint)-(float)(int)(fVar18 / fVar17) |
                        (uint)(float)(int)(fVar18 / fVar17) & -(uint)(0.0 < fVar19)) * value_step;
        if (max_value <= fVar18) {
          fVar18 = max_value;
        }
        local_110 = fVar20;
        if (fVar20 <= fVar18) {
          local_110 = fVar18;
        }
        local_e8 = ((local_110 - fVar20) / value_step) * fVar17 + fVar28;
        (in->input).mouse.buttons[0].clicked_pos.x = local_e8;
      }
    }
    if (((in != (nk_context *)0x0) && (fVar20 = (in->input).mouse.pos.x, fVar28 <= fVar20)) &&
       ((fVar20 < fVar28 + fVar22 &&
        ((fVar20 = (in->input).mouse.pos.y, bounds_00.y <= fVar20 && (fVar20 < bounds_00.y + fVar26)
         ))))) {
      ctx->last_widget_state = 0x12;
    }
    if ((((ctx->last_widget_state & 0x10) != 0) &&
        ((((uVar10 = 8, in == (nk_context *)0x0 ||
           (fVar20 = (in->input).mouse.prev.x, fVar20 < fVar28)) || (fVar28 + fVar22 <= fVar20)) ||
         ((fVar20 = (in->input).mouse.prev.y, fVar20 < bounds_00.y ||
          (bounds_00.y + fVar26 <= fVar20)))))) ||
       ((((in != (nk_context *)0x0 &&
          ((fVar20 = (in->input).mouse.prev.x, fVar28 <= fVar20 && (fVar20 < fVar28 + fVar22)))) &&
         (fVar20 = (in->input).mouse.prev.y, bounds_00.y <= fVar20)) &&
        (uVar10 = 0x40, fVar20 < bounds_00.y + fVar26)))) {
      ctx->last_widget_state = ctx->last_widget_state | uVar10;
    }
    p_Var5 = (ctx->style).slider.draw_begin;
    fVar20 = fVar26;
    if (p_Var5 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      local_68 = fVar22;
      fStack_64 = fVar26 - fVar16;
      fStack_60 = (auVar25._8_4_ - 0.0) - 0.0;
      fStack_5c = (auVar25._12_4_ - 0.0) - 0.0;
      local_58 = fVar26;
      fStack_54 = fVar26;
      fStack_50 = fVar26;
      fStack_4c = fVar26;
      local_48 = fVar16;
      fStack_44 = fVar16;
      fStack_40 = fVar16;
      fStack_3c = fVar16;
      (*p_Var5)(out,(nk_handle)(ctx->style).slider.userdata.ptr);
      fVar16 = local_48;
      fVar20 = local_58;
      fVar22 = local_68;
    }
    local_e8 = -fVar27 * 0.5 + local_e8;
    if ((ctx->last_widget_state & 0x20) == 0) {
      if ((ctx->last_widget_state & 0x10) == 0) {
        pnVar11 = &(ctx->style).slider;
        lVar12 = 0x748;
        lVar9 = 0x734;
      }
      else {
        pnVar11 = (nk_style_slider *)&(ctx->style).slider.hover;
        lVar12 = 0x768;
        lVar9 = 0x738;
      }
    }
    else {
      pnVar11 = (nk_style_slider *)&(ctx->style).slider.active;
      lVar12 = 0x788;
      lVar9 = 0x73c;
    }
    r.x = bounds_00.x + fVar21;
    rect_00.h = fVar26;
    rect_00.w = fVar22;
    piVar13 = (int *)((long)&(ctx->input).keyboard.keys[0].down + lVar12);
    c = *(nk_color *)((long)&(ctx->input).keyboard.keys[0].down + lVar9);
    fVar16 = fVar20 / -12.0 + fVar16 * 0.5 + fVar29;
    if ((pnVar11->normal).type == NK_STYLE_ITEM_IMAGE) {
      r.y = bounds_00.y;
      r.w = fVar22;
      r.h = fVar26;
      nk_draw_image(out,r,&(pnVar11->normal).data.image,(nk_color)0xffffffff);
    }
    else {
      rect.y = bounds_00.y;
      rect.x = r.x;
      rect.w = fVar22;
      rect.h = fVar26;
      nk_fill_rect(out,rect,(ctx->style).slider.rounding,(pnVar11->normal).data.color);
      rect_00.x = r.x;
      rect_00.y = bounds_00.y;
      nk_stroke_rect(out,rect_00,(ctx->style).slider.rounding,(ctx->style).slider.border,
                     (ctx->style).slider.border_color);
    }
    rect_01.w = fVar22;
    rect_01.h = fVar20 / 6.0;
    rect_01.x = fVar28;
    rect_01.y = fVar16;
    nk_fill_rect(out,rect_01,(ctx->style).slider.rounding,c);
    rect_02.h = fVar20 / 6.0;
    rect_02.w = (fVar27 * 0.5 + local_e8) - fVar28;
    rect_02.x = fVar28;
    rect_02.y = fVar16;
    nk_fill_rect(out,rect_02,(ctx->style).slider.rounding,(ctx->style).slider.bar_filled);
    img = (nk_image *)(piVar13 + 2);
    if (*piVar13 == 1) {
      r_00.y = fVar29;
      r_00.x = local_e8;
      r_00.w = nVar2.x;
      r_00.h = nVar2.y;
      nk_draw_image(out,r_00,img,(nk_color)0xffffffff);
    }
    else {
      r_01.y = fVar29;
      r_01.x = local_e8;
      r_01.w = nVar2.x;
      r_01.h = nVar2.y;
      nk_fill_circle(out,r_01,(nk_color)(img->handle).id);
    }
    p_Var5 = (ctx->style).slider.draw_end;
    if (p_Var5 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*p_Var5)(out,(nk_handle)(ctx->style).slider.userdata.ptr);
    }
    *value = local_110;
    uVar10 = (uint)(fVar1 != local_110);
  }
  return uVar10;
}

Assistant:

NK_API nk_bool
nk_slider_float(struct nk_context *ctx, float min_value, float *value, float max_value,
float value_step)
{
struct nk_window *win;
struct nk_panel *layout;
struct nk_input *in;
const struct nk_style *style;

int ret = 0;
float old_value;
struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
NK_ASSERT(value);
if (!ctx || !ctx->current || !ctx->current->layout || !value)
return ret;

win = ctx->current;
style = &ctx->style;
layout = win->layout;

state = nk_widget(&bounds, ctx);
if (!state) return ret;
in = (/*state == NK_WIDGET_ROM || */ layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

old_value = *value;
*value = nk_do_slider(&ctx->last_widget_state, &win->buffer, bounds, min_value,
old_value, max_value, value_step, &style->slider, in, style->font);
return (old_value > *value || old_value < *value);
}